

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcDec.c
# Opt level: O3

void Abc_TruthStoreRead(char *pFileName,Abc_TtStore_t *p)

{
  char *__ptr;
  long lVar1;
  char *pcVar2;
  long lVar3;
  long lVar4;
  
  __ptr = Abc_FileRead(pFileName);
  if (__ptr == (char *)0x0) {
    return;
  }
  lVar4 = 0;
  if (*__ptr != '\n') {
    lVar4 = 0;
    lVar3 = 0;
    pcVar2 = __ptr;
    do {
      Abc_TruthReadHex(p->pFuncs[lVar4],pcVar2,p->nVars);
      lVar1 = lVar3 << 0x20;
      lVar3 = (long)(int)lVar3;
      do {
        lVar1 = lVar1 + 0x100000000;
        pcVar2 = __ptr + lVar3;
        lVar3 = lVar3 + 1;
      } while (*pcVar2 != '\n');
      lVar4 = lVar4 + 1;
      pcVar2 = __ptr + (lVar1 >> 0x20);
    } while (__ptr[lVar1 >> 0x20] != '\n');
  }
  if ((int)lVar4 <= p->nFuncs) {
    p->nFuncs = (int)lVar4;
    free(__ptr);
    return;
  }
  __assert_fail("p->nFuncs >= nLines",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/abci/abcDec.c"
                ,0x156,"void Abc_TruthStoreRead(char *, Abc_TtStore_t *)");
}

Assistant:

void Abc_TruthStoreRead( char * pFileName, Abc_TtStore_t * p )
{
    char * pContents;
    int i, nLines;
    pContents = Abc_FileRead( pFileName );
    if ( pContents == NULL )
        return;
    // here it is assumed (without checking!) that each line of the file 
    // begins with a string of hexadecimal chars followed by space

    // the file will be read till the first empty line (pContents[i] == '\n')
    // (note that Abc_FileRead() added several empty lines at the end of the file contents)
    for ( nLines = i = 0; pContents[i] != '\n'; )
    {
        // read one line
        Abc_TruthReadHex( p->pFuncs[nLines++], &pContents[i], p->nVars );
        // skip till after the end-of-line symbol
        // (note that end-of-line symbol is also skipped)
        while ( pContents[i++] != '\n' );
    }
    // adjust the number of functions read 
    // (we may have allocated more storage because some lines in the file were empty)
    assert( p->nFuncs >= nLines );
    p->nFuncs = nLines;
    ABC_FREE( pContents );
}